

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O3

void duckdb::ExtractPivotExpressions(ParsedExpression *expr,case_insensitive_set_t *handled_columns)

{
  bool bVar1;
  ColumnRefExpression *this;
  string *psVar2;
  BinderException *this_00;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  if ((expr->super_BaseExpression).type == COLUMN_REF) {
    this = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    bVar1 = ColumnRefExpression::IsQualified(this);
    if (bVar1) {
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      local_40._M_unused._M_object = &local_30;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"PIVOT expression cannot contain qualified columns","");
      BinderException::BinderException<>(this_00,expr,(string *)&local_40);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    psVar2 = ColumnRefExpression::GetColumnName_abi_cxx11_(this);
    local_40._M_unused._M_object = handled_columns;
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)handled_columns,psVar2);
  }
  local_40._8_8_ = 0;
  local_28 = ::std::
             _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/tableref/bind_pivot.cpp:69:12)>
             ::_M_invoke;
  local_30 = ::std::
             _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/tableref/bind_pivot.cpp:69:12)>
             ::_M_manager;
  local_40._M_unused._M_object = handled_columns;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(duckdb::ParsedExpression_&)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,3);
  }
  return;
}

Assistant:

static void ExtractPivotExpressions(ParsedExpression &expr, case_insensitive_set_t &handled_columns) {
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &child_colref = expr.Cast<ColumnRefExpression>();
		if (child_colref.IsQualified()) {
			throw BinderException(expr, "PIVOT expression cannot contain qualified columns");
		}
		handled_columns.insert(child_colref.GetColumnName());
	}
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](ParsedExpression &child) { ExtractPivotExpressions(child, handled_columns); });
}